

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O0

void __thiscall miniros::Publication::dropAllConnections(Publication *this)

{
  bool bVar1;
  iterator this_00;
  element_type *peVar2;
  __normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
  *in_RDI;
  iterator i;
  scoped_lock<std::mutex> lock;
  V_SubscriberLink local_publishers;
  mutex_type *in_stack_ffffffffffffffa8;
  vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
  in_stack_ffffffffffffffc0;
  
  std::
  vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
  ::vector((vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
            *)0x488b4d);
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_RDI,in_stack_ffffffffffffffa8);
  std::
  vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
  ::swap((vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
          *)in_stack_ffffffffffffffc0._M_current,in_stack_ffffffffffffffb8);
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x488b85);
  this_00 = std::
            vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
            ::begin((vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
                     *)in_stack_ffffffffffffffa8);
  while( true ) {
    std::
    vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
    ::end((vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
           *)in_stack_ffffffffffffffa8);
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
                               *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
    ::operator*((__normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
                 *)&stack0xffffffffffffffc0);
    peVar2 = std::
             __shared_ptr_access<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x488bca);
    (*peVar2->_vptr_SubscriberLink[3])();
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
    ::operator++((__normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
                  *)&stack0xffffffffffffffc0);
  }
  std::
  vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
  ::~vector((vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
             *)this_00._M_current);
  return;
}

Assistant:

void Publication::dropAllConnections()
{
  // Swap our publishers list with a local one so we can only lock for a short period of time, because a
  // side effect of our calling drop() on connections can be re-locking the publishers mutex
  V_SubscriberLink local_publishers;

  {
    std::scoped_lock<std::mutex> lock(subscriber_links_mutex_);

    local_publishers.swap(subscriber_links_);
  }

  for (V_SubscriberLink::iterator i = local_publishers.begin();
           i != local_publishers.end(); ++i)
  {
    (*i)->drop();
  }
}